

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile
          (FileGenerator *this,FileDescriptor *file,CrossFileReferences *refs)

{
  bool bVar1;
  FileOptions_OptimizeMode FVar2;
  FileDescriptor *dep_00;
  int iVar3;
  long lVar4;
  btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
  *this_00;
  long lVar5;
  FileDescriptor *dep;
  FileDescriptor *local_50;
  undefined1 local_48 [24];
  
  local_48._0_8_ = this;
  local_48._8_8_ = refs;
  if (0 < *(int *)(file + 0x3c)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      ForEachField<true,google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
                ((Descriptor *)(*(long *)(file + 0x60) + lVar5),(anon_class_16_2_3fe543fb *)local_48
                );
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x98;
    } while (lVar4 < *(int *)(file + 0x3c));
  }
  if (0 < *(int *)(file + 4)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      GetCrossFileReferencesForField(this,(FieldDescriptor *)(*(long *)(file + 0x78) + lVar4),refs);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x58;
    } while (lVar5 < *(int *)(file + 4));
  }
  FVar2 = GetOptimizeFor(file,&this->options_,(bool *)0x0);
  if ((FVar2 != FileOptions_OptimizeMode_LITE_RUNTIME) && (0 < *(int *)(file + 0x30))) {
    iVar3 = 0;
    do {
      local_50 = (FileDescriptor *)google::protobuf::FileDescriptor::dependency((int)file);
      dep_00 = (FileDescriptor *)google::protobuf::FileDescriptor::dependency((int)file);
      bVar1 = ShouldSkipDependencyImports(this,dep_00);
      this_00 = (btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                 *)&refs->strong_reflection_files;
      if ((!bVar1) ||
         (bVar1 = IsDepWeak(this,local_50),
         this_00 = (btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
                    *)&refs->weak_reflection_files, bVar1)) {
        absl::lts_20240722::container_internal::
        btree<absl::lts_20240722::container_internal::set_params<google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,std::allocator<google::protobuf::FileDescriptor_const*>,256,false>>
        ::
        insert_unique<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*const&>
                  ((pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>,_bool>
                    *)local_48,this_00,&local_50,&local_50);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < *(int *)(file + 0x30));
  }
  return;
}

Assistant:

void FileGenerator::GetCrossFileReferencesForFile(const FileDescriptor* file,
                                                  CrossFileReferences* refs) {
  ForEachField(file, [this, refs](const FieldDescriptor* field) {
    GetCrossFileReferencesForField(field, refs);
  });

  if (!HasDescriptorMethods(file, options_)) {
    return;
  }

  for (int i = 0; i < file->dependency_count(); ++i) {
    const FileDescriptor* dep = file->dependency(i);

    if (!ShouldSkipDependencyImports(file->dependency(i))) {
      refs->strong_reflection_files.insert(dep);
    } else if (IsDepWeak(dep)) {
      refs->weak_reflection_files.insert(dep);
    }
  }
}